

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O3

iterator * __thiscall
density::
heter_queue<density::runtime_type<density::feature_list<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density_tests::feature_call_update>_>,_density::basic_default_allocator<65536UL>_>
::begin(iterator *__return_storage_ptr__,
       heter_queue<density::runtime_type<density::feature_list<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density_tests::feature_call_update>_>,_density::basic_default_allocator<65536UL>_>
       *this)

{
  void *pvVar1;
  QueueControl *i_control;
  
  i_control = this->m_head;
  while( true ) {
    if (this->m_tail == i_control) {
      __return_storage_ptr__->m_control = (ControlBlock *)0x0;
      __return_storage_ptr__->m_queue = this;
      return __return_storage_ptr__;
    }
    if ((i_control->m_next & 3) == 0) break;
    i_control = (QueueControl *)(i_control->m_next & 0xfffffffffffffff8);
  }
  __return_storage_ptr__->m_control = i_control;
  __return_storage_ptr__->m_queue = this;
  pvVar1 = get_element(i_control);
  (__return_storage_ptr__->m_value).m_pair.m_address = pvVar1;
  (__return_storage_ptr__->m_value).m_pair.m_type.m_feature_table =
       (tuple_type *)i_control[1].m_next;
  return __return_storage_ptr__;
}

Assistant:

iterator begin() noexcept { return iterator(this, first_valid(m_head)); }